

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifReduce.c
# Opt level: O3

void If_ManImproveMark_rec(If_Man_t *p,If_Obj_t *pObj,Vec_Ptr_t *vVisited)

{
  uint uVar1;
  int iVar2;
  void **ppvVar3;
  
  if ((*(uint *)pObj >> 8 & 1) == 0) {
    if ((*(uint *)pObj & 0xf) != 4) {
      __assert_fail("If_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifReduce.c"
                    ,0xba,"void If_ManImproveMark_rec(If_Man_t *, If_Obj_t *, Vec_Ptr_t *)");
    }
    If_ManImproveMark_rec(p,pObj->pFanin0,vVisited);
    If_ManImproveMark_rec(p,pObj->pFanin1,vVisited);
    uVar1 = vVisited->nSize;
    if (uVar1 == vVisited->nCap) {
      if ((int)uVar1 < 0x10) {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc(0x80);
        }
        else {
          ppvVar3 = (void **)realloc(vVisited->pArray,0x80);
        }
        vVisited->pArray = ppvVar3;
        vVisited->nCap = 0x10;
      }
      else {
        if (vVisited->pArray == (void **)0x0) {
          ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
        }
        else {
          ppvVar3 = (void **)realloc(vVisited->pArray,(ulong)uVar1 << 4);
        }
        vVisited->pArray = ppvVar3;
        vVisited->nCap = uVar1 * 2;
      }
    }
    else {
      ppvVar3 = vVisited->pArray;
    }
    iVar2 = vVisited->nSize;
    vVisited->nSize = iVar2 + 1;
    ppvVar3[iVar2] = pObj;
    pObj->field_0x1 = pObj->field_0x1 | 1;
  }
  return;
}

Assistant:

void If_ManImproveMark_rec( If_Man_t * p, If_Obj_t * pObj, Vec_Ptr_t * vVisited )
{
    if ( pObj->fMark )
        return;
    assert( If_ObjIsAnd(pObj) );
    If_ManImproveMark_rec( p, If_ObjFanin0(pObj), vVisited );
    If_ManImproveMark_rec( p, If_ObjFanin1(pObj), vVisited );
    Vec_PtrPush( vVisited, pObj );
    pObj->fMark = 1;
}